

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::PushLocalVariable(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger SVar1;
  sqvector<SQLocalVarInfo> *this_00;
  SQUnsignedInteger SVar2;
  long in_RDI;
  SQLocalVarInfo lvi;
  SQInteger pos;
  SQLocalVarInfo *in_stack_ffffffffffffff80;
  SQLocalVarInfo *in_stack_ffffffffffffff88;
  SQObjectPtr *in_stack_ffffffffffffff90;
  
  SVar1 = sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)(in_RDI + 8));
  SQLocalVarInfo::SQLocalVarInfo(in_stack_ffffffffffffff80);
  ::SQObjectPtr::operator=(in_stack_ffffffffffffff90,(SQObject *)in_stack_ffffffffffffff88);
  GetCurrentPos((SQFuncState *)0x128e79);
  this_00 = (sqvector<SQLocalVarInfo> *)
            sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)(in_RDI + 8));
  sqvector<SQLocalVarInfo>::push_back(this_00,in_stack_ffffffffffffff88);
  SVar2 = sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)(in_RDI + 8));
  if (*(ulong *)(in_RDI + 0x38) < SVar2) {
    SVar2 = sqvector<SQLocalVarInfo>::size((sqvector<SQLocalVarInfo> *)(in_RDI + 8));
    *(SQUnsignedInteger *)(in_RDI + 0x38) = SVar2;
  }
  SQLocalVarInfo::~SQLocalVarInfo((SQLocalVarInfo *)0x128f38);
  return SVar1;
}

Assistant:

SQInteger SQFuncState::PushLocalVariable(const SQObject &name)
{
    SQInteger pos=_vlocals.size();
    SQLocalVarInfo lvi;
    lvi._name=name;
    lvi._start_op=GetCurrentPos()+1;
    lvi._pos=_vlocals.size();
    _vlocals.push_back(lvi);
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize))_stacksize=_vlocals.size();
    return pos;
}